

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O0

bool __thiscall draco::MetadataDecoder::DecodeMetadata(MetadataDecoder *this,Metadata *metadata)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  Metadata *in_RSI;
  undefined8 *in_RDI;
  uint32_t i_1;
  uint32_t num_sub_metadata;
  uint32_t i;
  uint32_t num_entries;
  unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> sub_metadata;
  string sub_metadata_name;
  MetadataTuple mp;
  vector<MetadataTuple,_std::allocator<MetadataTuple>_> metadata_stack;
  int kMaxSubmetadataLevel;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Metadata *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffedd;
  undefined1 in_stack_fffffffffffffede;
  byte in_stack_fffffffffffffedf;
  string *name;
  Metadata *this_00;
  int local_c8;
  _Rb_tree_color local_c0;
  _Rb_tree_color local_bc;
  uint local_b8;
  uint local_b4;
  Metadata *in_stack_ffffffffffffff50;
  _Base_ptr in_stack_ffffffffffffff58;
  string local_a0 [36];
  uint local_7c;
  Metadata *local_78;
  Metadata *local_70;
  undefined8 local_68;
  undefined8 local_50;
  Metadata *local_48;
  undefined4 local_40;
  undefined4 local_1c;
  Metadata *local_18;
  byte local_1;
  
  local_1c = 1000;
  local_18 = in_RSI;
  std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::vector
            ((vector<MetadataTuple,_std::allocator<MetadataTuple>_> *)0x19a801);
  local_50 = 0;
  local_48 = local_18;
  local_40 = 0;
  std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::push_back
            ((vector<MetadataTuple,_std::allocator<MetadataTuple>_> *)in_stack_fffffffffffffec0,
             (value_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  do {
    bVar1 = std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::empty
                      ((vector<MetadataTuple,_std::allocator<MetadataTuple>_> *)
                       in_stack_fffffffffffffed0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_1 = 1;
      local_7c = 1;
LAB_0019acca:
      std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::~vector
                ((vector<MetadataTuple,_std::allocator<MetadataTuple>_> *)in_stack_fffffffffffffed0)
      ;
      return (bool)(local_1 & 1);
    }
    pvVar2 = std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::back
                       ((vector<MetadataTuple,_std::allocator<MetadataTuple>_> *)
                        in_stack_fffffffffffffec0);
    local_78 = pvVar2->parent_metadata;
    local_70 = pvVar2->decoded_metadata;
    local_68 = *(undefined8 *)&pvVar2->level;
    std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::pop_back
              ((vector<MetadataTuple,_std::allocator<MetadataTuple>_> *)0x19a893);
    local_18 = local_70;
    if (local_78 != (Metadata *)0x0) {
      if (1000 < (int)local_68) {
        local_1 = 0;
        local_7c = 1;
        goto LAB_0019acca;
      }
      std::__cxx11::string::string(local_a0);
      bVar1 = DecodeName((MetadataDecoder *)
                         CONCAT17(in_stack_fffffffffffffedf,
                                  CONCAT16(in_stack_fffffffffffffede,
                                           CONCAT15(in_stack_fffffffffffffedd,
                                                    CONCAT14(in_stack_fffffffffffffedc,
                                                             in_stack_fffffffffffffed8)))),
                         in_stack_fffffffffffffed0);
      if (bVar1) {
        operator_new(0x60);
        Metadata::Metadata(in_stack_fffffffffffffec0);
        name = (string *)&stack0xffffffffffffff58;
        std::unique_ptr<draco::Metadata,std::default_delete<draco::Metadata>>::
        unique_ptr<std::default_delete<draco::Metadata>,void>
                  ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                   in_stack_fffffffffffffec0,
                   (pointer)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_18 = std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::get
                             ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                              in_stack_fffffffffffffec0);
        this_00 = local_78;
        std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::unique_ptr
                  ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                   in_stack_fffffffffffffec0,
                   (unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        bVar1 = Metadata::AddSubMetadata
                          (this_00,name,
                           (unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                           CONCAT17(in_stack_fffffffffffffedf,
                                    CONCAT16(in_stack_fffffffffffffede,
                                             CONCAT15(in_stack_fffffffffffffedd,
                                                      CONCAT14(in_stack_fffffffffffffedc,
                                                               in_stack_fffffffffffffed8)))));
        in_stack_fffffffffffffedf = bVar1 ^ 0xff;
        std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::~unique_ptr
                  ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                   in_stack_fffffffffffffed0);
        bVar1 = (in_stack_fffffffffffffedf & 1) != 0;
        if (bVar1) {
          local_1 = 0;
        }
        local_7c = (uint)bVar1;
        std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::~unique_ptr
                  ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                   in_stack_fffffffffffffed0);
      }
      else {
        local_1 = 0;
        local_7c = 1;
      }
      std::__cxx11::string::~string(local_a0);
      if (local_7c != 0) goto LAB_0019acca;
    }
    if (local_18 == (Metadata *)0x0) {
      local_1 = 0;
      local_7c = 1;
      goto LAB_0019acca;
    }
    local_b4 = 0;
    in_stack_fffffffffffffede =
         DecodeVarint<unsigned_int>
                   ((uint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                    (DecoderBuffer *)0x19aaf1);
    if (!(bool)in_stack_fffffffffffffede) {
      local_1 = 0;
      local_7c = 1;
      goto LAB_0019acca;
    }
    for (local_b8 = 0; local_b8 < local_b4; local_b8 = local_b8 + 1) {
      in_stack_fffffffffffffedd =
           DecodeEntry((MetadataDecoder *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      if (!(bool)in_stack_fffffffffffffedd) {
        local_1 = 0;
        local_7c = 1;
        goto LAB_0019acca;
      }
    }
    local_bc = _S_red;
    in_stack_fffffffffffffedc =
         DecodeVarint<unsigned_int>
                   ((uint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                    (DecoderBuffer *)0x19aba3);
    if (!(bool)in_stack_fffffffffffffedc) {
      local_1 = 0;
      local_7c = 1;
      goto LAB_0019acca;
    }
    uVar3 = (ulong)local_bc;
    in_stack_fffffffffffffed0 = (string *)DecoderBuffer::remaining_size((DecoderBuffer *)*in_RDI);
    if ((long)in_stack_fffffffffffffed0 < (long)uVar3) {
      local_1 = 0;
      local_7c = 1;
      goto LAB_0019acca;
    }
    for (local_c0 = _S_red; local_c0 < local_bc; local_c0 = local_c0 + _S_black) {
      in_stack_fffffffffffffec0 = (Metadata *)&local_c8;
      in_stack_fffffffffffffebc = (int)local_68;
      if (local_78 != (Metadata *)0x0) {
        in_stack_fffffffffffffebc = (int)local_68 + 1;
      }
      local_c8 = in_stack_fffffffffffffebc;
      std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::push_back
                ((vector<MetadataTuple,_std::allocator<MetadataTuple>_> *)in_stack_fffffffffffffec0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
  } while( true );
}

Assistant:

bool MetadataDecoder::DecodeMetadata(Metadata *metadata) {
  // Limit metadata nesting depth to avoid stack overflow in destructor.
  constexpr int kMaxSubmetadataLevel = 1000;

  struct MetadataTuple {
    Metadata *parent_metadata;
    Metadata *decoded_metadata;
    int level;
  };
  std::vector<MetadataTuple> metadata_stack;
  metadata_stack.push_back({nullptr, metadata, 0});
  while (!metadata_stack.empty()) {
    const MetadataTuple mp = metadata_stack.back();
    metadata_stack.pop_back();
    metadata = mp.decoded_metadata;

    if (mp.parent_metadata != nullptr) {
      if (mp.level > kMaxSubmetadataLevel) {
        return false;
      }
      std::string sub_metadata_name;
      if (!DecodeName(&sub_metadata_name)) {
        return false;
      }
      std::unique_ptr<Metadata> sub_metadata =
          std::unique_ptr<Metadata>(new Metadata());
      metadata = sub_metadata.get();
      if (!mp.parent_metadata->AddSubMetadata(sub_metadata_name,
                                              std::move(sub_metadata))) {
        return false;
      }
    }
    if (metadata == nullptr) {
      return false;
    }

    uint32_t num_entries = 0;
    if (!DecodeVarint(&num_entries, buffer_)) {
      return false;
    }
    for (uint32_t i = 0; i < num_entries; ++i) {
      if (!DecodeEntry(metadata)) {
        return false;
      }
    }
    uint32_t num_sub_metadata = 0;
    if (!DecodeVarint(&num_sub_metadata, buffer_)) {
      return false;
    }
    if (num_sub_metadata > buffer_->remaining_size()) {
      // The decoded number of metadata items is unreasonably high.
      return false;
    }
    for (uint32_t i = 0; i < num_sub_metadata; ++i) {
      metadata_stack.push_back(
          {metadata, nullptr, mp.parent_metadata ? mp.level + 1 : mp.level});
    }
  }
  return true;
}